

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O1

void __thiscall Pyraminx::print(Pyraminx *this)

{
  int layer;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int entry;
  int iVar5;
  bool bVar6;
  
  iVar4 = 0;
  iVar1 = 1;
  iVar3 = 6;
  iVar2 = iVar4;
  do {
    for (; iVar4 != 0; iVar4 = iVar4 + -1) {
      putchar(0x20);
    }
    iVar4 = iVar3;
    do {
      Face::print_triangle
                ((this->red_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,L,
                 3 - iVar2,iVar4);
      bVar6 = iVar4 != 0;
      iVar4 = iVar4 + -1;
    } while (bVar6);
    putchar(0x20);
    iVar4 = 0;
    do {
      Face::print_triangle
                ((this->blue_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,U,
                 iVar2,iVar4);
      iVar4 = iVar4 + 1;
    } while (iVar1 != iVar4);
    putchar(0x20);
    iVar4 = iVar3;
    do {
      Face::print_triangle
                ((this->yellow_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,R,
                 3 - iVar2,iVar4);
      bVar6 = iVar4 != 0;
      iVar4 = iVar4 + -1;
      iVar5 = iVar2;
    } while (bVar6);
    for (; iVar5 != 0; iVar5 = iVar5 + -1) {
      putchar(0x20);
    }
    putchar(10);
    iVar4 = iVar2 + 1;
    iVar1 = iVar1 + 2;
    iVar3 = iVar3 + -2;
    iVar2 = iVar4;
  } while (iVar4 != 4);
  iVar4 = 3;
  iVar2 = 7;
  iVar1 = 0;
  do {
    printf("     ");
    iVar3 = iVar1;
    iVar5 = iVar2;
    if (iVar4 != 3) {
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    do {
      iVar5 = iVar5 + -1;
      Face::print_triangle
                ((this->green_face).super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_ptr,B,
                 iVar4,iVar5);
    } while (0 < iVar5);
    iVar3 = iVar1;
    if (iVar4 != 3) {
      do {
        putchar(0x20);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
    }
    putchar(10);
    iVar1 = iVar1 + 1;
    iVar2 = iVar2 + -2;
    bVar6 = iVar4 != 0;
    iVar4 = iVar4 + -1;
  } while (bVar6);
  return;
}

Assistant:

void Pyraminx::print(){
    for(int layer = 0; layer < 4; layer++){
        int top_row_len = 2*layer +1;
        int bottom_row_len = (7- top_row_len) + 1;
        for(int j = 0; j < (7-bottom_row_len)/2; j++){
            printf(" ");
        }
        for(int entry = 0; entry < bottom_row_len; entry++){
            red_face->print_triangle(Corner::L, 3-layer, (bottom_row_len - 1) - entry);
        }
        printf(" ");
        for(int entry = 0; entry < top_row_len; entry++){
            blue_face->print_triangle(Corner::U, layer, entry);
        }
        printf(" ");
        for(int entry = 0; entry < bottom_row_len; entry++){
            yellow_face->print_triangle(Corner::R, 3-layer, (bottom_row_len - 1) - entry);
        }
        for(int j = 0; j < (7-bottom_row_len)/2; j++){
                printf(" ");
        }
        printf("\n");
    }
    for(int layer = 3; layer >=0; layer--){
        int row_len = layer*2 + 1;
        printf("     "); // Offset so green appears below blue
        for(int j = 0; j < (7 - row_len)/2; j++){
                printf(" ");
        }
        for(int entry = row_len - 1; entry >= 0; entry--){
            green_face->print_triangle(Corner::B, layer, entry);
        }
        for(int j = 0; j < (7 - row_len)/2; j++){
                printf(" ");
        }
        printf("\n");
    }
}